

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall Physical::Physical(Physical *this)

{
  Physical *this_local;
  
  this->_vptr_Physical = (_func_int **)&PTR__Physical_001904a0;
  std::__cxx11::string::string((string *)&this->physicalDescription);
  Unit::Unit(&this->physicalUnit);
  this->dQuantity = 0.0;
  return;
}

Assistant:

Physical::Physical()
{
	dQuantity = 0;
}